

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flechette.cpp
# Opt level: O2

int AF_A_PoisonBagCheck(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  DObject *this;
  bool bVar3;
  FState *newstate;
  AActor *this_00;
  char *__assertion;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053ae49;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0053ad76:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053ae49;
        }
      }
      if (numparam == 1) goto LAB_0053adee;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053ae39;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053ae49;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053ae39;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053adee:
        iVar2 = this_00->special1;
        this_00->special1 = iVar2 + -1;
        if (iVar2 < 2) {
          FName::FName(&local_1c,"Death");
          newstate = AActor::FindState(this_00,&local_1c);
          AActor::SetState(this_00,newstate,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053ae49;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0053ad76;
  }
LAB_0053ae39:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053ae49:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                ,0x181,"int AF_A_PoisonBagCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PoisonBagCheck)
{
	PARAM_ACTION_PROLOGUE;

	if (--self->special1 <= 0)
	{
		self->SetState (self->FindState ("Death"));
	}
	else
	{
		return 0;
	}
	return 0;
}